

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

bool __thiscall
gui::DrawWindow(gui *this,IFrameBuffer *fb,TRect client,CWindow *wnd,bool parentDirty)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  TPoint this_01;
  TPoint TVar2;
  byte bVar3;
  _List_node_base *p_Var4;
  TRect client_00;
  int y;
  int x;
  int local_a0;
  int local_9c;
  TRect local_98;
  TRect local_88;
  undefined **local_78;
  IFrameBuffer *local_70;
  TPoint local_68;
  undefined ***local_60;
  undefined **local_50;
  IFrameBuffer *local_48;
  TPoint local_40;
  gui *local_38;
  
  this_01 = client.p1;
  TVar2 = client.p0;
  if (*(bool *)((long)this_01 + 0x750) == true) {
    local_88.p0 = (TPoint)fb;
    local_88.p1 = TVar2;
    CWindow::GetAbsoluteCoords((CWindow *)this_01,&local_9c,&local_a0);
    local_48 = fb;
    local_40 = TVar2;
    if ((client.p0.x < (int)fb) || (client.p0.y < (int)((ulong)fb >> 0x20))) {
      __assert_fail("rect.Valid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vitalych[P]GUI/src/Framebuffer.h"
                    ,100,"gui::CFrameBufferBase::CFrameBufferBase(TRect)");
    }
    local_60 = &local_50;
    local_50 = &PTR_DrawRect_001386f8;
    local_78 = &PTR_DrawRect_00138750;
    bVar3 = (byte)wnd | *(bool *)((long)this_01 + 0x759);
    local_70 = fb;
    local_68 = TVar2;
    local_38 = this;
    if (bVar3 == 1) {
      (**(code **)(*(long *)this_01 + 0x40))(this_01,&local_78);
    }
    local_98.p0.x = local_9c;
    local_98.p0.y = local_a0;
    TVar2 = ((TRect *)((long)this_01 + 0x718))->p0;
    local_98.p1.x = (local_9c + (*(TPoint *)((long)this_01 + 0x720)).x) - TVar2.x;
    local_98.p1.y = (local_a0 + (*(TPoint *)((long)this_01 + 0x720)).y) - TVar2.y;
    bVar1 = TRect::ClipRect(&local_88,&local_98);
    if (bVar1) {
      for (p_Var4 = (((Children *)((long)this_01 + 0x738))->
                    super__List_base<std::shared_ptr<gui::CWindow>,_std::allocator<std::shared_ptr<gui::CWindow>_>_>
                    )._M_impl._M_node.super__List_node_base._M_next;
          p_Var4 != (_List_node_base *)((long)this_01 + 0x738); p_Var4 = p_Var4->_M_next) {
        TVar2 = (TPoint)p_Var4[1]._M_next;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_prev;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        client_00.p1 = TVar2;
        client_00.p0 = local_98.p1;
        bVar1 = DrawWindow(this,(IFrameBuffer *)CONCAT44(local_98.p0.y,local_98.p0.x),client_00,
                           (CWindow *)(ulong)(bVar3 & 1),parentDirty);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        bVar3 = bVar3 | bVar1;
      }
      *(bool *)((long)this_01 + 0x759) = false;
      goto LAB_0012030a;
    }
  }
  bVar3 = 0;
LAB_0012030a:
  return (bool)(bVar3 & 1);
}

Assistant:

bool DrawWindow(IFrameBuffer &fb, TRect client, CWindow &wnd, bool parentDirty) {
    if (!wnd.Visible()) {
        return false;
    }

    int x, y;
    wnd.GetAbsoluteCoords(x, y);

    CClippedFrameBuffer cfb(fb, client);
    CTranslatedFrameBuffer tfb(cfb, TPoint(x, y));

    auto dirty = wnd.IsDirty() || parentDirty;
    if (dirty) {
        wnd.Draw(tfb);
    }

    auto thisRect = TRect(x, y, x + wnd.GetWidth() - 1, y + wnd.GetHeight() - 1);
    if (!client.ClipRect(thisRect)) {
        return false;
    }

    for (auto child : wnd.GetChildren()) {
        dirty |= DrawWindow(fb, thisRect, *child.get(), dirty);
    }

    wnd.SetDirty(false);
    return dirty;
}